

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ImportInfo * __thiscall cmGeneratorTarget::GetImportInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  iterator iVar3;
  ImportInfo *pIVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_bool>
  pVar5;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_278;
  ImportInfo local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
  local_148;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    if (config->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_278);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_148.first,config);
      std::__cxx11::string::operator=((string *)&local_278,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
            ::find(&(this->ImportInfoMap)._M_t,&local_278);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_258.Location._M_dataplus._M_p = (pointer)&local_258.Location.field_2;
      local_258.NoSOName = false;
      local_258.Managed = Native;
      local_258.Multiplicity = 0;
      local_258.Location._M_string_length = 0;
      local_258.Location.field_2._M_local_buf[0] = '\0';
      local_258.SOName._M_dataplus._M_p = (pointer)&local_258.SOName.field_2;
      local_258.SOName._M_string_length = 0;
      local_258.SOName.field_2._M_local_buf[0] = '\0';
      local_258.ImportLibrary._M_dataplus._M_p = (pointer)&local_258.ImportLibrary.field_2;
      local_258.ImportLibrary._M_string_length = 0;
      local_258.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_258.LibName._M_dataplus._M_p = (pointer)&local_258.LibName.field_2;
      local_258.LibName._M_string_length = 0;
      local_258.LibName.field_2._M_local_buf[0] = '\0';
      local_258.Languages._M_dataplus._M_p = (pointer)&local_258.Languages.field_2;
      local_258.Languages._M_string_length = 0;
      local_258.Languages.field_2._M_local_buf[0] = '\0';
      local_258.Libraries._M_dataplus._M_p = (pointer)&local_258.Libraries.field_2;
      local_258.Libraries._M_string_length = 0;
      local_258.Libraries.field_2._M_local_buf[0] = '\0';
      local_258.LibrariesProp._M_dataplus._M_p = (pointer)&local_258.LibrariesProp.field_2;
      local_258.LibrariesProp._M_string_length = 0;
      local_258.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_258.SharedDeps._M_dataplus._M_p = (pointer)&local_258.SharedDeps.field_2;
      local_258.SharedDeps._M_string_length = 0;
      local_258.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_278,&local_258);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ImportInfo_&,_true>
                (&local_148,&local_278,&local_258);
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
              ::
              _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
                          *)&this->ImportInfoMap,&local_148);
      iVar3._M_node = (_Base_ptr)pVar5.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::~pair(&local_148);
      ImportInfo::~ImportInfo(&local_258);
    }
    TVar2 = GetType(this);
    if (((TVar2 == INTERFACE_LIBRARY) || (iVar3._M_node[2]._M_right != (_Base_ptr)0x0)) ||
       (iVar3._M_node[4]._M_right != (_Base_ptr)0x0)) {
      pIVar4 = (ImportInfo *)(iVar3._M_node + 2);
    }
    else {
      pIVar4 = (ImportInfo *)0x0;
    }
    std::__cxx11::string::~string((string *)&local_278);
  }
  else {
    pIVar4 = (ImportInfo *)0x0;
  }
  return pIVar4;
}

Assistant:

cmGeneratorTarget::ImportInfo const* cmGeneratorTarget::GetImportInfo(
  const std::string& config) const
{
  // There is no imported information for non-imported targets.
  if (!this->IsImported()) {
    return nullptr;
  }

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  } else {
    config_upper = "NOCONFIG";
  }

  ImportInfoMapType::const_iterator i = this->ImportInfoMap.find(config_upper);
  if (i == this->ImportInfoMap.end()) {
    ImportInfo info;
    this->ComputeImportInfo(config_upper, info);
    ImportInfoMapType::value_type entry(config_upper, info);
    i = this->ImportInfoMap.insert(entry).first;
  }

  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return &i->second;
  }
  // If the location is empty then the target is not available for
  // this configuration.
  if (i->second.Location.empty() && i->second.ImportLibrary.empty()) {
    return nullptr;
  }

  // Return the import information.
  return &i->second;
}